

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

ssize_t __thiscall Arcflow::write(Arcflow *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  FILE *__stream;
  undefined4 extraout_var;
  runtime_error *prVar2;
  void *__buf_00;
  size_t __n_00;
  undefined4 in_register_00000034;
  char *__buf_01;
  char _error_msg_ [256];
  char acStack_118 [264];
  
  __buf_01 = acStack_118;
  if (this->ready != false) {
    __stream = fopen((char *)CONCAT44(in_register_00000034,__fd),"w");
    if (__stream != (FILE *)0x0) {
      write(this,(int)__stream,__buf_00,__n);
      iVar1 = fclose(__stream);
      return CONCAT44(extraout_var,iVar1);
    }
    perror("fopen");
    snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "fout != NULL",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x266);
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar2,acStack_118);
    write((int)prVar2,__buf_01,__n_00);
  }
  snprintf(acStack_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "ready == true",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x261);
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,acStack_118);
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Arcflow::write(const char *fname) {
	throw_assert(ready == true);
	FILE *fout = fopen(fname, "w");
	if (fout == NULL) {
		perror("fopen");
	}
	throw_assert(fout != NULL);
	write(fout);
	fclose(fout);
}